

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast_operators.hpp
# Opt level: O3

bool duckdb::TryDecimalStringCast<duckdb::hugeint_t,(char)44>
               (char *string_ptr,idx_t string_size,hugeint_t *result,uint8_t width,uint8_t scale)

{
  byte bVar1;
  char cVar2;
  char *pcVar3;
  char *pcVar4;
  bool bVar5;
  byte bVar6;
  uint uVar7;
  undefined1 *puVar8;
  uint uVar9;
  undefined7 in_register_00000009;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  duckdb *pdVar13;
  undefined1 uVar14;
  uint uVar15;
  char *pcVar16;
  ulong uVar17;
  undefined1 *puVar18;
  short local_7a;
  char *local_78;
  char *local_70;
  char *local_68;
  DecimalCastData<duckdb::hugeint_t> local_60;
  hugeint_t *local_38;
  
  uVar15 = (uint)scale;
  local_38 = result;
  hugeint_t::hugeint_t(&local_60.result,0);
  uVar17 = (ulong)(uint)((int)CONCAT71(in_register_00000009,width) << 4);
  puVar8 = Hugeint::POWERS_OF_TEN;
  local_60.digit_count = '\0';
  local_60.decimal_count = '\0';
  local_60.round_set = false;
  local_60.should_round = false;
  local_60.excessive_decimals = '\0';
  local_60.exponent_type = NONE;
  local_60.limit.lower = *(uint64_t *)(Hugeint::POWERS_OF_TEN + uVar17);
  local_60.limit.upper = *(int64_t *)(Hugeint::POWERS_OF_TEN + uVar17 + 8);
  if (string_size == 0) {
    return false;
  }
  puVar18 = (undefined1 *)0x0;
  while( true ) {
    bVar6 = string_ptr[(long)puVar18];
    puVar8 = (undefined1 *)CONCAT71((int7)((ulong)puVar8 >> 8),bVar6);
    if ((4 < bVar6 - 9) && (bVar6 != 0x20)) break;
    puVar18 = puVar18 + 1;
    if ((undefined1 *)string_size == puVar18) {
      return false;
    }
  }
  local_60.width = width;
  local_60.scale = scale;
  if (bVar6 == 0x2d) {
    puVar8 = (undefined1 *)(string_size - 1);
    if (puVar8 == puVar18) {
      DecimalCastOperation::Finalize<duckdb::DecimalCastData<duckdb::hugeint_t>,true>(&local_60);
      return false;
    }
    pcVar12 = (char *)(string_size - (long)puVar18);
    pcVar10 = &DAT_00000001;
    do {
      uVar14 = (undefined1)uVar15;
      cVar2 = (pcVar10 + (long)string_ptr)[(long)puVar18];
      uVar7 = (uint)CONCAT71((int7)((ulong)puVar8 >> 8),cVar2);
      uVar9 = uVar7 - 0x30;
      if (9 < (byte)uVar9) {
        pcVar16 = pcVar10;
        if (cVar2 != ',') goto LAB_00b8fde4;
        pcVar16 = pcVar10 + 1;
        pcVar3 = pcVar16;
        local_70 = pcVar16;
        pcVar4 = local_78;
        goto joined_r0x00b8fc99;
      }
      bVar5 = DecimalCastOperation::HandleDigit<duckdb::DecimalCastData<duckdb::hugeint_t>,true>
                        (&local_60,(byte)uVar9);
      if (!bVar5) {
        return false;
      }
      puVar8 = (undefined1 *)(~(ulong)pcVar10 + string_size);
      pcVar11 = pcVar12;
      if (puVar8 == puVar18) break;
      if ((pcVar10 + (long)string_ptr)[(long)(puVar18 + 1)] == '_') {
        if ((undefined1 *)((string_size - (long)pcVar10) + -2) == puVar18) {
          return false;
        }
        pcVar10 = pcVar10 + 2;
        bVar6 = (string_ptr + (long)pcVar10)[(long)puVar18] - 0x30;
        puVar8 = (undefined1 *)CONCAT71((int7)((ulong)(string_ptr + (long)pcVar10) >> 8),bVar6);
        if (9 < bVar6) {
          return false;
        }
      }
      else {
        pcVar10 = pcVar10 + 1;
      }
      pcVar11 = pcVar10;
    } while (pcVar10 < pcVar12);
LAB_00b8fe2b:
    bVar5 = DecimalCastOperation::Finalize<duckdb::DecimalCastData<duckdb::hugeint_t>,true>
                      (&local_60);
    if (!bVar5) {
      return false;
    }
    if (pcVar11 < (char *)0x2) {
      return false;
    }
    goto LAB_00b8ff55;
  }
  if (bVar6 == 0x30 && (undefined1 *)(string_size - 1) != puVar18) {
    bVar1 = string_ptr[(long)(puVar18 + 1)];
    if (bVar1 < 0x62) {
      if ((bVar1 != 0x42) && (bVar1 != 0x58)) goto LAB_00b8fbdc;
    }
    else if ((bVar1 != 0x62) && (bVar1 != 0x78)) goto LAB_00b8fbdc;
    if ((string_size - (long)puVar18) - 3 < 0xfffffffffffffffe) {
      return false;
    }
  }
  else {
LAB_00b8fbdc:
    pcVar10 = (char *)(string_size - (long)puVar18);
    pcVar12 = (char *)(ulong)(bVar6 == 0x2b);
    local_78 = pcVar12;
    if (pcVar12 < pcVar10) {
      do {
        uVar14 = (undefined1)uVar15;
        cVar2 = (string_ptr + (long)pcVar12)[(long)puVar18];
        uVar7 = (uint)CONCAT71((int7)((ulong)puVar8 >> 8),cVar2);
        uVar9 = uVar7 - 0x30;
        if (9 < (byte)uVar9) {
          pcVar16 = pcVar12;
          if (cVar2 != ',') goto LAB_00b8feee;
          pcVar16 = pcVar12 + 1;
          pcVar3 = pcVar16;
          local_68 = pcVar16;
          pcVar4 = local_70;
          goto joined_r0x00b8fd3b;
        }
        bVar5 = DecimalCastOperation::HandleDigit<duckdb::DecimalCastData<duckdb::hugeint_t>,false>
                          (&local_60,(byte)uVar9);
        if (!bVar5) {
          return false;
        }
        puVar8 = (undefined1 *)(~(ulong)pcVar12 + string_size);
        pcVar11 = pcVar10;
        if (puVar8 == puVar18) break;
        if ((string_ptr + (long)pcVar12)[(long)(puVar18 + 1)] == '_') {
          if ((undefined1 *)((string_size - (long)pcVar12) + -2) == puVar18) {
            return false;
          }
          pcVar12 = pcVar12 + 2;
          bVar6 = (string_ptr + (long)pcVar12)[(long)puVar18] - 0x30;
          puVar8 = (undefined1 *)CONCAT71((int7)((ulong)(string_ptr + (long)pcVar12) >> 8),bVar6);
          if (9 < bVar6) {
            return false;
          }
        }
        else {
          pcVar12 = pcVar12 + 1;
        }
        pcVar11 = pcVar12;
      } while (pcVar12 < pcVar10);
LAB_00b8ff35:
      bVar5 = DecimalCastOperation::Finalize<duckdb::DecimalCastData<duckdb::hugeint_t>,false>
                        (&local_60);
      if (!bVar5) {
        return false;
      }
      if (pcVar11 <= local_78) {
        return false;
      }
LAB_00b8ff55:
      local_38->lower = local_60.result.lower;
      local_38->upper = local_60.result.upper;
      return true;
    }
  }
  DecimalCastOperation::Finalize<duckdb::DecimalCastData<duckdb::hugeint_t>,false>(&local_60);
  return false;
joined_r0x00b8fc99:
  pcVar11 = pcVar16;
  local_78 = pcVar4;
  if (pcVar12 <= pcVar16) {
LAB_00b8feb2:
    if ((pcVar10 <= &DAT_00000001) && (pcVar11 <= local_70)) {
      return false;
    }
    goto LAB_00b8fe2b;
  }
  uVar14 = (undefined1)uVar15;
  local_78 = string_ptr + (long)pcVar16;
  uVar7 = (uint)CONCAT71((int7)((ulong)pcVar3 >> 8),local_78[(long)puVar18]);
  bVar6 = (byte)(uVar7 - 0x30);
  if (9 < bVar6) {
    uVar9 = CONCAT31((int3)(uVar7 - 0x30 >> 8),&DAT_00000001 < pcVar10);
    local_78 = pcVar4;
    if (pcVar16 <= local_70 && &DAT_00000001 >= pcVar10) {
      return false;
    }
LAB_00b8fde4:
    uVar7 = uVar7 & 0xff;
    if (uVar7 < 0x20) {
      if (4 < uVar7 - 9) {
        return false;
      }
LAB_00b8fdfb:
      pcVar16 = pcVar16 + 1;
      pcVar11 = pcVar16;
      if (pcVar16 < pcVar12) {
        do {
          if ((4 < (byte)(string_ptr + (long)pcVar16)[(long)puVar18] - 9) &&
             ((string_ptr + (long)pcVar16)[(long)puVar18] != 0x20)) {
            return false;
          }
          pcVar16 = pcVar16 + 1;
          pcVar11 = pcVar12;
        } while (pcVar12 != pcVar16);
      }
      goto LAB_00b8fe2b;
    }
    if ((uVar7 != 0x65) && (uVar7 != 0x45)) {
      if (uVar7 != 0x20) {
        return false;
      }
      goto LAB_00b8fdfb;
    }
    if (pcVar16 == &DAT_00000001) {
      return false;
    }
    if (pcVar12 <= pcVar16 + 1) {
      return false;
    }
    local_7a = 0;
    pdVar13 = (duckdb *)(string_ptr + (long)pcVar16 + (long)(puVar18 + 1));
    pcVar10 = (char *)(~(ulong)puVar18 + (string_size - (long)pcVar16));
    if (*pdVar13 == (duckdb)0x2d) {
      bVar5 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)44>
                        (pdVar13,pcVar10,(idx_t)&local_7a,(IntegerCastData<short> *)(ulong)uVar9,
                         (bool)uVar14);
    }
    else {
      bVar5 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)44>
                        (pdVar13,pcVar10,(idx_t)&local_7a,(IntegerCastData<short> *)(ulong)uVar9,
                         (bool)uVar14);
    }
    if (bVar5 == false) {
      return false;
    }
    bVar5 = DecimalCastOperation::HandleExponent<duckdb::DecimalCastData<duckdb::hugeint_t>,true>
                      (&local_60,(int)local_7a);
    goto LAB_00b90033;
  }
  bVar5 = DecimalCastOperation::HandleDecimal<duckdb::DecimalCastData<duckdb::hugeint_t>,true,true>
                    (&local_60,bVar6);
  if (!bVar5) {
    return false;
  }
  pcVar11 = pcVar12;
  if ((undefined1 *)(~(ulong)pcVar16 + string_size) == puVar18) goto LAB_00b8feb2;
  pcVar4 = local_78;
  if (local_78[(long)(puVar18 + 1)] == '_') {
    if ((undefined1 *)((string_size - (long)pcVar16) + -2) == puVar18) {
      return false;
    }
    pcVar16 = pcVar16 + 2;
    bVar6 = (string_ptr + (long)pcVar16)[(long)puVar18] - 0x30;
    pcVar3 = (char *)CONCAT71((int7)((ulong)(string_ptr + (long)pcVar16) >> 8),bVar6);
    if (9 < bVar6) {
      return false;
    }
  }
  else {
    pcVar16 = pcVar16 + 1;
    pcVar3 = local_78;
  }
  goto joined_r0x00b8fc99;
joined_r0x00b8fd3b:
  pcVar11 = pcVar16;
  local_70 = pcVar4;
  if (pcVar10 <= pcVar16) {
LAB_00b8ffc7:
    if ((pcVar12 <= local_78) && (pcVar11 <= local_68)) {
      return false;
    }
    goto LAB_00b8ff35;
  }
  uVar14 = (undefined1)uVar15;
  local_70 = string_ptr + (long)pcVar16;
  uVar7 = (uint)CONCAT71((int7)((ulong)pcVar3 >> 8),local_70[(long)puVar18]);
  bVar6 = (byte)(uVar7 - 0x30);
  if (9 < bVar6) {
    uVar9 = CONCAT31((int3)(uVar7 - 0x30 >> 8),local_78 < pcVar12);
    local_70 = pcVar4;
    if (pcVar16 <= local_68 && local_78 >= pcVar12) {
      return false;
    }
LAB_00b8feee:
    uVar7 = uVar7 & 0xff;
    if (uVar7 < 0x20) {
      if (4 < uVar7 - 9) {
        return false;
      }
    }
    else {
      if ((uVar7 == 0x65) || (uVar7 == 0x45)) {
        if (pcVar16 == local_78) {
          return false;
        }
        if (pcVar10 <= pcVar16 + 1) {
          return false;
        }
        local_7a = 0;
        pdVar13 = (duckdb *)(string_ptr + (long)pcVar16 + (long)(puVar18 + 1));
        pcVar10 = (char *)(~(ulong)puVar18 + (string_size - (long)pcVar16));
        if (*pdVar13 == (duckdb)0x2d) {
          bVar5 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)44>
                            (pdVar13,pcVar10,(idx_t)&local_7a,(IntegerCastData<short> *)(ulong)uVar9
                             ,(bool)uVar14);
        }
        else {
          bVar5 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)44>
                            (pdVar13,pcVar10,(idx_t)&local_7a,(IntegerCastData<short> *)(ulong)uVar9
                             ,(bool)uVar14);
        }
        if (bVar5 == false) {
          return false;
        }
        bVar5 = DecimalCastOperation::
                HandleExponent<duckdb::DecimalCastData<duckdb::hugeint_t>,false>
                          (&local_60,(int)local_7a);
LAB_00b90033:
        if (bVar5 == false) {
          return false;
        }
        goto LAB_00b8ff55;
      }
      if (uVar7 != 0x20) {
        return false;
      }
    }
    pcVar16 = pcVar16 + 1;
    pcVar11 = pcVar16;
    if (pcVar16 < pcVar10) {
      do {
        if ((4 < (byte)(string_ptr + (long)pcVar16)[(long)puVar18] - 9) &&
           ((string_ptr + (long)pcVar16)[(long)puVar18] != 0x20)) {
          return false;
        }
        pcVar16 = pcVar16 + 1;
        pcVar11 = pcVar10;
      } while (pcVar10 != pcVar16);
    }
    goto LAB_00b8ff35;
  }
  bVar5 = DecimalCastOperation::HandleDecimal<duckdb::DecimalCastData<duckdb::hugeint_t>,false,true>
                    (&local_60,bVar6);
  if (!bVar5) {
    return false;
  }
  pcVar11 = pcVar10;
  if ((undefined1 *)(~(ulong)pcVar16 + string_size) == puVar18) goto LAB_00b8ffc7;
  pcVar4 = local_70;
  if (local_70[(long)(puVar18 + 1)] == '_') {
    if ((undefined1 *)((string_size - (long)pcVar16) + -2) == puVar18) {
      return false;
    }
    pcVar16 = pcVar16 + 2;
    bVar6 = (string_ptr + (long)pcVar16)[(long)puVar18] - 0x30;
    pcVar3 = (char *)CONCAT71((int7)((ulong)(string_ptr + (long)pcVar16) >> 8),bVar6);
    if (9 < bVar6) {
      return false;
    }
  }
  else {
    pcVar16 = pcVar16 + 1;
    pcVar3 = local_70;
  }
  goto joined_r0x00b8fd3b;
}

Assistant:

bool TryDecimalStringCast(const char *string_ptr, idx_t string_size, T &result, uint8_t width, uint8_t scale) {
	DecimalCastData<T> state;
	state.result = 0;
	state.width = width;
	state.scale = scale;
	state.digit_count = 0;
	state.decimal_count = 0;
	state.excessive_decimals = 0;
	state.exponent_type = ExponentType::NONE;
	state.round_set = false;
	state.should_round = false;
	state.limit = UnsafeNumericCast<T>(DecimalCastTraits<T>::POWERS_OF_TEN_CLASS::POWERS_OF_TEN[width]);
	if (!TryIntegerCast<DecimalCastData<T>, true, true, DecimalCastOperation, false, decimal_separator>(
	        string_ptr, string_size, state, false)) {
		return false;
	}
	result = state.result;
	return true;
}